

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prod_tests1.cpp
# Opt level: O2

void __thiscall
test::prod_test::iutest_typed_test_suite_p_name_ProdTypeParamTest_::Friend<int>::Body
          (Friend<int> *this)

{
  int *in_R9;
  AssertionResult iutest_ar;
  iuCodeMessage local_1c0;
  iuCodeMessage local_190 [8];
  
  s_prod._4_4_ = 1;
  local_1c0.m_message._M_dataplus._M_p._0_4_ = s_prod._4_4_;
  local_190[0].m_message._M_dataplus._M_p._0_4_ = s_prod._4_4_;
  iutest::internal::CmpHelperEQ<int,int>
            (&iutest_ar,(internal *)0x31e18d,"s_prod.GetX()",(char *)local_190,(int *)&local_1c0,
             in_R9);
  if (iutest_ar.m_result == false) {
    memset(local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_190);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1c0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/prod_tests1.cpp"
               ,0x68,iutest_ar.m_message._M_dataplus._M_p);
    local_1c0._44_4_ = 2;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c0,(Fixed *)local_190);
  }
  else {
    std::__cxx11::string::~string((string *)&iutest_ar);
    s_prod._4_4_ = 2;
    local_1c0.m_message._M_dataplus._M_p._0_4_ = s_prod._4_4_;
    local_190[0].m_message._M_dataplus._M_p._0_4_ = s_prod._4_4_;
    iutest::internal::CmpHelperEQ<int,int>
              (&iutest_ar,(internal *)0x316376,"s_prod.GetX()",(char *)local_190,(int *)&local_1c0,
               in_R9);
    if (iutest_ar.m_result != false) goto LAB_0028f62c;
    memset(local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_190);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1c0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/prod_tests1.cpp"
               ,0x6b,iutest_ar.m_message._M_dataplus._M_p);
    local_1c0._44_4_ = 2;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c0,(Fixed *)local_190);
  }
  std::__cxx11::string::~string((string *)&local_1c0);
  iutest::iu_global_format_stringstream::~iu_global_format_stringstream
            ((iu_global_format_stringstream *)local_190);
LAB_0028f62c:
  std::__cxx11::string::~string((string *)&iutest_ar);
  return;
}

Assistant:

IUTEST_TYPED_TEST_P(ProdTypeParamTest, Friend)
{
    s_prod.SetX(1);
    IUTEST_ASSERT_EQ(1, s_prod.GetX());

    s_prod.m_x = 2;
    IUTEST_ASSERT_EQ(2, s_prod.GetX());
}